

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadSceneNode(ColladaParser *this,Node *pNode)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Node *pNVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mapped_type *ppNVar5;
  long lVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_> *this_00;
  undefined4 extraout_var_04;
  vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_> *this_01;
  Logger *pLVar7;
  undefined4 extraout_var_05;
  vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_> *this_02
  ;
  char *pcVar8;
  string *psVar9;
  string local_138;
  allocator<char> local_109;
  string local_108;
  char *local_e8;
  char *url_1;
  undefined1 auStack_d8 [4];
  int attrID_3;
  size_type sStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_c8;
  allocator<char> local_a9;
  string local_a8;
  char *local_88;
  char *url;
  undefined1 auStack_78 [4];
  int attrID_2;
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_68;
  char *local_58;
  char *s_1;
  char *pcStack_48;
  int attrID_1;
  char *s;
  uint local_38;
  int attrId;
  int attrName;
  int attrSID;
  int attrID;
  Node *local_20;
  Node *child;
  Node *pNode_local;
  ColladaParser *this_local;
  
  child = pNode;
  pNode_local = (Node *)this;
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"node");
        if (bVar1) {
          pNVar4 = (Node *)operator_new(0x118);
          Collada::Node::Node(pNVar4);
          local_20 = pNVar4;
          attrName = TestAttribute(this,"id");
          if (-1 < attrName) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)(uint)attrName);
            std::__cxx11::string::operator=
                      ((string *)&local_20->mID,(char *)CONCAT44(extraout_var,iVar3));
          }
          attrId = TestAttribute(this,"sid");
          if (-1 < attrId) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)(uint)attrId);
            std::__cxx11::string::operator=
                      ((string *)&local_20->mSID,(char *)CONCAT44(extraout_var_00,iVar3));
          }
          local_38 = TestAttribute(this,"name");
          if (-1 < (int)local_38) {
            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_38);
            std::__cxx11::string::operator=
                      ((string *)local_20,(char *)CONCAT44(extraout_var_01,iVar3));
          }
          pNVar4 = local_20;
          if (child == (Node *)0x0) {
            ppNVar5 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
                      ::operator[](&this->mNodeLibrary,&local_20->mID);
            *ppNVar5 = pNVar4;
          }
          else {
            std::vector<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>::
            push_back(&child->mChildren,&local_20);
            local_20->mParent = child;
          }
          ReadSceneNode(this,local_20);
        }
        else if (child != (Node *)0x0) {
          bVar1 = IsElement(this,"lookat");
          if (bVar1) {
            ReadNodeTransformation(this,child,TF_LOOKAT);
          }
          else {
            bVar1 = IsElement(this,"matrix");
            if (bVar1) {
              ReadNodeTransformation(this,child,TF_MATRIX);
            }
            else {
              bVar1 = IsElement(this,"rotate");
              if (bVar1) {
                ReadNodeTransformation(this,child,TF_ROTATE);
              }
              else {
                bVar1 = IsElement(this,"scale");
                if (bVar1) {
                  ReadNodeTransformation(this,child,TF_SCALE);
                }
                else {
                  bVar1 = IsElement(this,"skew");
                  if (bVar1) {
                    ReadNodeTransformation(this,child,TF_SKEW);
                  }
                  else {
                    bVar1 = IsElement(this,"translate");
                    if (bVar1) {
                      ReadNodeTransformation(this,child,TF_TRANSLATE);
                    }
                    else {
                      bVar1 = IsElement(this,"render");
                      if (((bVar1) && (child->mParent == (Node *)0x0)) &&
                         (lVar6 = std::__cxx11::string::length(), lVar6 == 0)) {
                        s._4_4_ = TestAttribute(this,"camera_node");
                        if (s._4_4_ != 0xffffffff) {
                          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                            (this->mReader,(ulong)s._4_4_);
                          pcStack_48 = (char *)CONCAT44(extraout_var_02,iVar3);
                          if (*pcStack_48 == '#') {
                            std::__cxx11::string::operator=
                                      ((string *)&child->mPrimaryCamera,pcStack_48 + 1);
                          }
                          else {
                            pLVar7 = DefaultLogger::get();
                            Logger::error(pLVar7,"Collada: Unresolved reference format of camera");
                          }
                        }
                      }
                      else {
                        bVar1 = IsElement(this,"instance_node");
                        if (bVar1) {
                          s_1._4_4_ = TestAttribute(this,"url");
                          if (s_1._4_4_ != 0xffffffff) {
                            iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                              (this->mReader,(ulong)s_1._4_4_);
                            local_58 = (char *)CONCAT44(extraout_var_03,iVar3);
                            if (*local_58 == '#') {
                              this_00 = &child->mNodeInstances;
                              local_68._M_allocated_capacity = 0;
                              local_68._8_8_ = 0;
                              auStack_78[0] = (_Alloc_hider)0x0;
                              stack0xffffffffffffff89 = 0;
                              sStack_70 = 0;
                              Collada::NodeInstance::NodeInstance((NodeInstance *)auStack_78);
                              std::
                              vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
                              ::push_back(this_00,(NodeInstance *)auStack_78);
                              Collada::NodeInstance::~NodeInstance((NodeInstance *)auStack_78);
                              pcVar8 = local_58 + 1;
                              psVar9 = (string *)
                                       std::
                                       vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>
                                       ::back(&child->mNodeInstances);
                              std::__cxx11::string::operator=(psVar9,pcVar8);
                            }
                            else {
                              pLVar7 = DefaultLogger::get();
                              Logger::error(pLVar7,"Collada: Unresolved reference format of node");
                            }
                          }
                        }
                        else {
                          bVar1 = IsElement(this,"instance_geometry");
                          if ((bVar1) || (bVar1 = IsElement(this,"instance_controller"), bVar1)) {
                            ReadNodeGeometry(this,child);
                          }
                          else {
                            bVar1 = IsElement(this,"instance_light");
                            if (bVar1) {
                              url._4_4_ = TestAttribute(this,"url");
                              if (url._4_4_ == 0xffffffff) {
                                pLVar7 = DefaultLogger::get();
                                Logger::warn(pLVar7,
                                             "Collada: Expected url attribute in <instance_light> element"
                                            );
                              }
                              else {
                                iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                                  (this->mReader,(ulong)url._4_4_);
                                local_88 = (char *)CONCAT44(extraout_var_04,iVar3);
                                if (*local_88 != '#') {
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_a8,
                                             "Unknown reference format in <instance_light> element",
                                             &local_a9);
                                  ThrowException(this,&local_a8);
                                }
                                this_01 = &child->mLights;
                                local_c8._M_allocated_capacity = 0;
                                local_c8._8_8_ = 0;
                                auStack_d8[0] = (_Alloc_hider)0x0;
                                stack0xffffffffffffff29 = 0;
                                sStack_d0 = 0;
                                Collada::LightInstance::LightInstance((LightInstance *)auStack_d8);
                                std::
                                vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
                                ::push_back(this_01,(LightInstance *)auStack_d8);
                                Collada::LightInstance::~LightInstance((LightInstance *)auStack_d8);
                                pcVar8 = local_88 + 1;
                                psVar9 = (string *)
                                         std::
                                         vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>
                                         ::back(&child->mLights);
                                std::__cxx11::string::operator=(psVar9,pcVar8);
                              }
                            }
                            else {
                              bVar1 = IsElement(this,"instance_camera");
                              if (bVar1) {
                                url_1._4_4_ = TestAttribute(this,"url");
                                if (url_1._4_4_ == 0xffffffff) {
                                  pLVar7 = DefaultLogger::get();
                                  Logger::warn(pLVar7,
                                               "Collada: Expected url attribute in <instance_camera> element"
                                              );
                                }
                                else {
                                  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                                                    (this->mReader,(ulong)url_1._4_4_);
                                  local_e8 = (char *)CONCAT44(extraout_var_05,iVar3);
                                  if (*local_e8 != '#') {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_108,
                                               "Unknown reference format in <instance_camera> element"
                                               ,&local_109);
                                    ThrowException(this,&local_108);
                                  }
                                  this_02 = &child->mCameras;
                                  local_138.field_2._M_allocated_capacity = 0;
                                  local_138.field_2._8_8_ = 0;
                                  local_138._M_dataplus = (_Alloc_hider)0x0;
                                  local_138._1_7_ = 0;
                                  local_138._M_string_length = 0;
                                  Collada::CameraInstance::CameraInstance
                                            ((CameraInstance *)&local_138);
                                  std::
                                  vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
                                  ::push_back(this_02,(value_type *)&local_138);
                                  Collada::CameraInstance::~CameraInstance
                                            ((CameraInstance *)&local_138);
                                  pcVar8 = local_e8 + 1;
                                  psVar9 = (string *)
                                           std::
                                           vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>
                                           ::back(&child->mCameras);
                                  std::__cxx11::string::operator=(psVar9,pcVar8);
                                }
                              }
                              else {
                                SkipElement(this);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
  }
  return;
}

Assistant:

void ColladaParser::ReadSceneNode(Node* pNode)
{
    // quit immediately on <bla/> elements
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("node"))
            {
                Node* child = new Node;
                int attrID = TestAttribute("id");
                if (attrID > -1)
                    child->mID = mReader->getAttributeValue(attrID);
                int attrSID = TestAttribute("sid");
                if (attrSID > -1)
                    child->mSID = mReader->getAttributeValue(attrSID);

                int attrName = TestAttribute("name");
                if (attrName > -1)
                    child->mName = mReader->getAttributeValue(attrName);

                // TODO: (thom) support SIDs
                // ai_assert( TestAttribute( "sid") == -1);

                if (pNode)
                {
                    pNode->mChildren.push_back(child);
                    child->mParent = pNode;
                }
                else
                {
                    // no parent node given, probably called from <library_nodes> element.
                    // create new node in node library
                    mNodeLibrary[child->mID] = child;
                }

                // read on recursively from there
                ReadSceneNode(child);
                continue;
            }
            // For any further stuff we need a valid node to work on
            else if (!pNode)
                continue;

            if (IsElement("lookat"))
                ReadNodeTransformation(pNode, TF_LOOKAT);
            else if (IsElement("matrix"))
                ReadNodeTransformation(pNode, TF_MATRIX);
            else if (IsElement("rotate"))
                ReadNodeTransformation(pNode, TF_ROTATE);
            else if (IsElement("scale"))
                ReadNodeTransformation(pNode, TF_SCALE);
            else if (IsElement("skew"))
                ReadNodeTransformation(pNode, TF_SKEW);
            else if (IsElement("translate"))
                ReadNodeTransformation(pNode, TF_TRANSLATE);
            else if (IsElement("render") && pNode->mParent == NULL && 0 == pNode->mPrimaryCamera.length())
            {
                // ... scene evaluation or, in other words, postprocessing pipeline,
                // or, again in other words, a turing-complete description how to
                // render a Collada scene. The only thing that is interesting for
                // us is the primary camera.
                int attrId = TestAttribute("camera_node");
                if (-1 != attrId)
                {
                    const char* s = mReader->getAttributeValue(attrId);
                    if (s[0] != '#')
                        ASSIMP_LOG_ERROR("Collada: Unresolved reference format of camera");
                    else
                        pNode->mPrimaryCamera = s + 1;
                }
            }
            else if (IsElement("instance_node"))
            {
                // find the node in the library
                int attrID = TestAttribute("url");
                if (attrID != -1)
                {
                    const char* s = mReader->getAttributeValue(attrID);
                    if (s[0] != '#')
                        ASSIMP_LOG_ERROR("Collada: Unresolved reference format of node");
                    else
                    {
                        pNode->mNodeInstances.push_back(NodeInstance());
                        pNode->mNodeInstances.back().mNode = s + 1;
                    }
                }
            }
            else if (IsElement("instance_geometry") || IsElement("instance_controller"))
            {
                // Reference to a mesh or controller, with possible material associations
                ReadNodeGeometry(pNode);
            }
            else if (IsElement("instance_light"))
            {
                // Reference to a light, name given in 'url' attribute
                int attrID = TestAttribute("url");
                if (-1 == attrID)
                    ASSIMP_LOG_WARN("Collada: Expected url attribute in <instance_light> element");
                else
                {
                    const char* url = mReader->getAttributeValue(attrID);
                    if (url[0] != '#')
                        ThrowException("Unknown reference format in <instance_light> element");

                    pNode->mLights.push_back(LightInstance());
                    pNode->mLights.back().mLight = url + 1;
                }
            }
            else if (IsElement("instance_camera"))
            {
                // Reference to a camera, name given in 'url' attribute
                int attrID = TestAttribute("url");
                if (-1 == attrID)
                    ASSIMP_LOG_WARN("Collada: Expected url attribute in <instance_camera> element");
                else
                {
                    const char* url = mReader->getAttributeValue(attrID);
                    if (url[0] != '#')
                        ThrowException("Unknown reference format in <instance_camera> element");

                    pNode->mCameras.push_back(CameraInstance());
                    pNode->mCameras.back().mCamera = url + 1;
                }
            }
            else
            {
                // skip everything else for the moment
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}